

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O2

void diy::detail::recv_block(AuxBlock *param_1,ProxyWithLink *cp,Master *master)

{
  int from;
  MemoryBuffer *pMVar1;
  mapped_type *pmVar2;
  void *__args;
  Link *l;
  ulong uVar3;
  int move_gid;
  Master *local_d8;
  function<void_(void_*,_diy::BinaryBuffer_&)> *local_d0;
  function<void_*()> *local_c8;
  IncomingQueues *local_c0;
  vector<int,_std::allocator<int>_> incoming_gids;
  MemoryBuffer local_98;
  function<void_(void_*,_diy::BinaryBuffer_&)> local_50;
  
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Master::Proxy::incoming(&cp->super_Proxy,&incoming_gids);
  local_c0 = &(cp->super_Proxy).incoming_;
  local_c8 = &(master->blocks_).create_;
  local_d0 = &(master->blocks_).load_;
  local_d8 = master;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    from = incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
    pMVar1 = Master::Proxy::incoming(&cp->super_Proxy,from);
    if ((pMVar1->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pMVar1->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_98.super_BinaryBuffer._vptr_BinaryBuffer._0_4_ = from;
      pmVar2 = Catch::clara::std::
               map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
               ::operator[](local_c0,(key_type *)&local_98);
      (*(pmVar2->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar2,&move_gid,4);
      Catch::clara::std::function<void_*()>::function((function<void_*()> *)&local_98,local_c8);
      __args = Catch::clara::std::function<void_*()>::operator()((function<void_*()> *)&local_98);
      Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_98);
      local_98.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001c25e8;
      local_98.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.blob_position = 0;
      local_98.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.position = 0;
      local_98.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Master::Proxy::dequeue<std::vector<char,std::allocator<char>>>
                (&cp->super_Proxy,from,&local_98.buffer,load<std::vector<char,std::allocator<char>>>
                );
      Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::function(&local_50,local_d0);
      Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::operator()
                (&local_50,__args,&local_98.super_BinaryBuffer);
      Catch::clara::std::_Function_base::~_Function_base(&local_50.super__Function_base);
      Master::Proxy::dequeue<std::vector<char,std::allocator<char>>>
                (&cp->super_Proxy,from,&local_98.buffer,load<std::vector<char,std::allocator<char>>>
                );
      l = LinkFactory::load(&local_98.super_BinaryBuffer);
      Master::add(local_d8,move_gid,__args,l);
      MemoryBuffer::~MemoryBuffer(&local_98);
    }
  }
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&incoming_gids.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

inline void recv_block(AuxBlock*,                                      // local block (unused)
                const diy::Master::ProxyWithLink&   cp,         // communication proxy for neighbor blocks
                diy::Master&                        master)     // real master with multiple blocks per process
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);

    // for anything incoming, dequeue data received in the last exchange
    for (int i = 0; i < incoming_gids.size(); i++)
    {
        int gid = incoming_gids[i];
        if (cp.incoming(gid).size())
        {
            // dequeue the gid of the moving block
            int move_gid;
            cp.dequeue(gid, move_gid);

            // dequeue the block
            void* recv_b = master.creator()();
            diy::MemoryBuffer bb;
            cp.dequeue(gid, bb.buffer);
            master.loader()(recv_b, bb);

            // dequeue the link
            diy::Link* recv_link;
            cp.dequeue(gid, bb.buffer);
            recv_link = diy::LinkFactory::load(bb);

            // add block to the master
            master.add(move_gid, recv_b, recv_link);
        }
    }
}